

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bossac.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 uVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  socklen_t sVar6;
  undefined **__n;
  pointer *__ptr;
  char *pcVar7;
  size_t in_R9;
  uint32_t totalErrors;
  uint32_t pageErrors;
  Flasher flasher;
  Samba samba;
  PortFactory portFactory;
  CmdOpts cmd;
  FlasherInfo info;
  BossaObserver observer;
  undefined1 local_198 [16];
  uint local_188;
  uint local_184;
  Device local_180;
  Flasher local_160;
  Samba local_140;
  LinuxPortFactory local_120;
  CmdOpts local_f0;
  undefined1 local_c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88 [3];
  _Bit_type *local_58;
  uint local_50;
  _Bit_type *local_48;
  uint local_40;
  _Bit_pointer local_38;
  FlasherObserver local_30;
  undefined4 local_28;
  
  sVar6 = 0x13;
  CmdOpts::CmdOpts(&local_f0,argc,argv,0x13,opts);
  pcVar7 = *argv;
  pcVar5 = strrchr(pcVar7,0x2f);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = strrchr(pcVar7,0x5c);
    if (pcVar5 != (char *)0x0) goto LAB_00105a76;
  }
  else {
LAB_00105a76:
    *argv = pcVar5 + 1;
  }
  if (argc < 2) {
    main_cold_8();
  }
  else {
    uVar3 = CmdOpts::parse(&local_f0);
    if ((int)uVar3 < 0) {
      main_cold_7();
    }
    else if (config.read == true) {
      if ((config.write == false) && (config.verify != true)) {
LAB_00105ad6:
        if (uVar3 != argc) {
          argc = argc - 1;
          goto LAB_00105ae2;
        }
        main_cold_5();
      }
      else {
        main_cold_6();
      }
    }
    else {
      if ((config.write != false) || (config.verify == true)) goto LAB_00105ad6;
LAB_00105ae2:
      if (uVar3 == argc) {
        if (config.help == false) {
          if (config.version == false) {
            Samba::Samba(&local_140);
            LinuxPortFactory::LinuxPortFactory(&local_120);
            if (config.debug == true) {
              local_140._debug = true;
            }
            if (config.port == false) {
              LinuxPortFactory::def_abi_cxx11_((string *)local_c8,&local_120);
              std::__cxx11::string::operator=((string *)&config.portArg,(string *)local_c8);
              if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
                operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
              }
            }
            if (config.arduinoErase == true) {
              LinuxPortFactory::create((LinuxPortFactory *)local_c8,(string *)&local_120,true);
              uVar1 = local_c8._0_8_;
              sVar6 = 0;
              cVar2 = (**(code **)(*(undefined **)local_c8._0_8_ + 0x10))
                                (local_c8._0_8_,0x4b0,8,0,0);
              if (cVar2 != '\0') {
                (**(code **)(*(undefined **)uVar1 + 0x60))(uVar1,1);
                (**(code **)(*(undefined **)uVar1 + 0x58))(uVar1,0);
                (**(code **)(*(undefined **)uVar1 + 0x18))(uVar1);
                (**(code **)(*(undefined **)uVar1 + 8))(uVar1);
                goto LAB_00105c5e;
              }
              main_cold_2();
LAB_001061f8:
              iVar4 = 1;
            }
            else {
LAB_00105c5e:
              if (config.portArg._M_string_length == 0) {
                main_cold_4();
                goto LAB_001061f8;
              }
              if (config.usbPort == true) {
                sVar6 = (socklen_t)config.usbPortArg;
                LinuxPortFactory::create
                          ((LinuxPortFactory *)(local_198 + 8),(string *)&local_120,true);
                iVar4 = Samba::connect(&local_140,(int)local_198 + 8,(sockaddr *)0x1c200,sVar6);
                cVar2 = (char)iVar4;
                if ((long *)local_198._8_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_198._8_8_ + 8))();
                }
                local_198._8_8_ = (long *)0x0;
              }
              else {
                LinuxPortFactory::create((LinuxPortFactory *)local_198,(string *)&local_120);
                iVar4 = Samba::connect(&local_140,(int)local_198,(sockaddr *)0x1c200,sVar6);
                cVar2 = (char)iVar4;
                if ((_func_int **)local_198._0_8_ != (_func_int **)0x0) {
                  (**(code **)(*(_func_int **)local_198._0_8_ + 8))();
                }
                local_198._0_8_ = (_func_int **)0x0;
              }
              if (cVar2 == '\0') {
                main_cold_3();
                goto LAB_001061f8;
              }
              local_180._vptr_Device = (_func_int **)&PTR__Device_00118088;
              local_180._flash._M_t.super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
              super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
              super__Head_base<0UL,_Flash_*,_false>._M_head_impl =
                   (__uniq_ptr_data<Flash,_std::default_delete<Flash>,_true,_true>)
                   (__uniq_ptr_impl<Flash,_std::default_delete<Flash>_>)0x0;
              local_180._family = FAMILY_NONE;
              local_180._samba = &local_140;
              Device::create(&local_180);
              local_160._flash = &local_180._flash;
              local_160._observer = &local_30;
              local_30._vptr_FlasherObserver = (_func_int **)&PTR__FlasherObserver_00118020;
              local_28 = 0xffffffff;
              __n = &PTR__Flasher_001180b8;
              local_160._vptr_Flasher = (_func_int **)&PTR__Flasher_001180b8;
              local_160._samba = &local_140;
              if (config.info == true) {
                local_c8._8_8_ = &local_b0;
                local_c8._0_8_ = &PTR__FlasherInfo_001180e8;
                local_c8._16_8_ = 0;
                local_b0._M_local_buf[0] = '\0';
                __n = (undefined **)local_88;
                local_90 = 0;
                local_88[0]._M_local_buf[0] = '\0';
                local_58 = (_Bit_type *)0x0;
                local_50 = 0;
                local_48 = (_Bit_type *)0x0;
                local_40 = 0;
                local_38 = (_Bit_pointer)0x0;
                local_98._M_p = (pointer)__n;
                Flasher::info(&local_160,(FlasherInfo *)local_c8);
                FlasherInfo::print((FlasherInfo *)local_c8);
                FlasherInfo::~FlasherInfo((FlasherInfo *)local_c8);
              }
              if (config.unlock == true) {
                Flasher::lock(&local_160,&config.unlockArg,false);
              }
              if (config.erase == true) {
                gettimeofday((timeval *)&start_time,(__timezone_ptr_t)0x0);
                Flasher::erase(&local_160,config.offsetArg);
                gettimeofday((timeval *)local_c8,(__timezone_ptr_t)0x0);
                __n = (undefined **)(local_c8._8_8_ + -start_time.tv_usec);
                printf("\nDone in %5.3f seconds\n",
                       (double)(float)((double)(long)__n / 1000000.0 +
                                      (double)(local_c8._0_8_ - start_time.tv_sec)));
              }
              if (config.write == true) {
                gettimeofday((timeval *)&start_time,(__timezone_ptr_t)0x0);
                Flasher::write(&local_160,(int)argv[uVar3],(void *)(ulong)(uint)config.offsetArg,
                               (size_t)__n);
                gettimeofday((timeval *)local_c8,(__timezone_ptr_t)0x0);
                printf("\nDone in %5.3f seconds\n",
                       (double)(float)((double)(local_c8._8_8_ - start_time.tv_usec) / 1000000.0 +
                                      (double)(local_c8._0_8_ - start_time.tv_sec)));
              }
              if (config.verify == true) {
                gettimeofday((timeval *)&start_time,(__timezone_ptr_t)0x0);
                iVar4 = Flasher::verify(&local_160,(EVP_PKEY_CTX *)argv[uVar3],(uchar *)&local_184,
                                        (size_t)&local_188,(uchar *)(ulong)(uint)config.offsetArg,
                                        in_R9);
                if ((char)iVar4 != '\0') {
                  gettimeofday((timeval *)local_c8,(__timezone_ptr_t)0x0);
                  printf("\nVerify successful\nDone in %5.3f seconds\n",
                         (double)(float)((double)(local_c8._8_8_ - start_time.tv_usec) / 1000000.0 +
                                        (double)(local_c8._0_8_ - start_time.tv_sec)));
                  goto LAB_00105fab;
                }
                printf("\nVerify failed\nPage errors: %d\nByte errors: %d\n",(ulong)local_184,
                       (ulong)local_188);
                iVar4 = 2;
              }
              else {
LAB_00105fab:
                if (config.read == true) {
                  gettimeofday((timeval *)&start_time,(__timezone_ptr_t)0x0);
                  Flasher::read(&local_160,(int)argv[uVar3],(void *)(ulong)(uint)config.readArg,
                                (ulong)(uint)config.offsetArg);
                  gettimeofday((timeval *)local_c8,(__timezone_ptr_t)0x0);
                  printf("\nDone in %5.3f seconds\n",
                         (double)(float)((double)(local_c8._8_8_ - start_time.tv_usec) / 1000000.0 +
                                        (double)(local_c8._0_8_ - start_time.tv_sec)));
                }
                if (config.boot == true) {
                  pcVar7 = "true";
                  if (config.bootArg == 0) {
                    pcVar7 = "false";
                  }
                  printf("Set boot flash %s\n",pcVar7);
                  (**(code **)(*(long *)local_180._flash._M_t.
                                        super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>
                                        .super__Head_base<0UL,_Flash_*,_false>._M_head_impl + 0xa8))
                            (local_180._flash._M_t.
                             super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                             super__Head_base<0UL,_Flash_*,_false>._M_head_impl,config.bootArg != 0)
                  ;
                }
                if (config.bod == true) {
                  pcVar7 = "true";
                  if (config.bodArg == 0) {
                    pcVar7 = "false";
                  }
                  printf("Set brownout detect %s\n",pcVar7);
                  (*(*(_func_int ***)
                      local_180._flash._M_t.
                      super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                      super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                      super__Head_base<0UL,_Flash_*,_false>._M_head_impl)[0xf])
                            (local_180._flash._M_t.
                             super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                             super__Head_base<0UL,_Flash_*,_false>._M_head_impl,
                             (ulong)(config.bodArg != 0));
                }
                if (config.bor == true) {
                  pcVar7 = "true";
                  if (config.borArg == 0) {
                    pcVar7 = "false";
                  }
                  printf("Set brownout reset %s\n",pcVar7);
                  (**(code **)(*(long *)local_180._flash._M_t.
                                        super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>
                                        .super__Head_base<0UL,_Flash_*,_false>._M_head_impl + 0x90))
                            (local_180._flash._M_t.
                             super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                             super__Head_base<0UL,_Flash_*,_false>._M_head_impl,config.borArg != 0);
                }
                if (config.security == true) {
                  puts("Set security");
                  (*(*(_func_int ***)
                      local_180._flash._M_t.
                      super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                      super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                      super__Head_base<0UL,_Flash_*,_false>._M_head_impl)[0xd])();
                }
                if (config.lock == true) {
                  Flasher::lock(&local_160,&config.lockArg,true);
                }
                (**(code **)(*(long *)local_180._flash._M_t.
                                      super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t
                                      .super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                                      super__Head_base<0UL,_Flash_*,_false>._M_head_impl + 0xb8))();
                iVar4 = 0;
                if (config.reset == true) {
                  Device::reset(&local_180);
                  iVar4 = 0;
                }
              }
              local_180._vptr_Device = (_func_int **)&PTR__Device_00118088;
              if (local_180._flash._M_t.super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                  _M_t.super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                  super__Head_base<0UL,_Flash_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<Flash,_std::default_delete<Flash>_>)0x0) {
                (*(*(_func_int ***)
                    local_180._flash._M_t.super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                    _M_t.super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                    super__Head_base<0UL,_Flash_*,_false>._M_head_impl)[1])();
              }
            }
            LinuxPortFactory::~LinuxPortFactory(&local_120);
            Samba::~Samba(&local_140);
            goto LAB_00106211;
          }
        }
        else {
          printf("Usage: %s [OPTION...] [FILE]\n",*argv);
        }
        puts(
            "Basic Open Source SAM-BA Application (BOSSA) Version \nFlash programmer for Atmel SAM devices.\nCopyright (c) 2011-2018 ShumaTech (http://www.shumatech.com)"
            );
        iVar4 = 0;
        if (config.help == true) {
          puts(
              "\nExamples:\n  bossac -e -w -v -b image.bin   # Erase flash, write flash with image.bin,\n                                 # verify the write, and set boot from flash\n  bossac -r0x10000 image.bin     # Read 64KB from flash and store in image.bin"
              );
          puts("\nOptions:");
          CmdOpts::usage(&local_f0,_stdout);
          puts("\nReport bugs to <bugs@shumatech.com>");
          iVar4 = 0;
        }
        goto LAB_00106211;
      }
      main_cold_1();
    }
  }
  iVar4 = 1;
LAB_00106211:
  CmdOpts::~CmdOpts(&local_f0);
  return iVar4;
}

Assistant:

int
main(int argc, char* argv[])
{
    int args;
    char* pos;
    CmdOpts cmd(argc, argv, sizeof(opts) / sizeof(opts[0]), opts);

    if ((pos = strrchr(argv[0], '/')) || (pos = strrchr(argv[0], '\\')))
        argv[0] = pos + 1;

    if (argc <= 1)
    {
        fprintf(stderr, "%s: you must specify at least one option\n", argv[0]);
        return help(argv[0]);
    }

    args = cmd.parse();
    if (args < 0)
        return help(argv[0]);

    if (config.read && (config.write || config.verify))
    {
        fprintf(stderr, "%s: read option is exclusive of write or verify\n", argv[0]);
        return help(argv[0]);
    }

    if (config.read || config.write || config.verify)
    {
        if (args == argc)
        {
            fprintf(stderr, "%s: missing file\n", argv[0]);
            return help(argv[0]);
        }
        argc--;
    }
    if (args != argc)
    {
        fprintf(stderr, "%s: extra arguments found\n", argv[0]);
        return help(argv[0]);
    }

    if (config.help || config.version)
    {
        if (config.help)
            printf("Usage: %s [OPTION...] [FILE]\n", argv[0]);
        printf("Basic Open Source SAM-BA Application (BOSSA) Version \n"
               "Flash programmer for Atmel SAM devices.\n"
               "Copyright (c) 2011-2018 ShumaTech (http://www.shumatech.com)\n"
              );
        if (config.help)
        {
            printf("\n"
                   "Examples:\n"
                   "  bossac -e -w -v -b image.bin   # Erase flash, write flash with image.bin,\n"
                   "                                 # verify the write, and set boot from flash\n"
                   "  bossac -r0x10000 image.bin     # Read 64KB from flash and store in image.bin\n"
                  );
            printf("\nOptions:\n");
            cmd.usage(stdout);
            printf("\nReport bugs to <bugs@shumatech.com>\n");
        }
        return 0;
    }

    try
    {
        Samba samba;
        PortFactory portFactory;

        if (config.debug)
            samba.setDebug(true);

        if (!config.port)
            config.portArg = portFactory.def();

        if (config.arduinoErase)
        {
            SerialPort::Ptr port;
            port = portFactory.create(config.portArg, config.usbPortArg != 0);

            if(!port->open(1200))
            {
                fprintf(stderr, "Failed to open port at 1200bps\n");
                return 1;
            }

            port->setRTS(true);
            port->setDTR(false);
            port->close();
        }

        if (config.portArg.empty())
        {
            fprintf(stderr, "No serial ports available\n");
            return 1;
        }

        bool res;
        if (config.usbPort)
            res = samba.connect(portFactory.create(config.portArg, config.usbPortArg != 0));
        else
            res = samba.connect(portFactory.create(config.portArg));
        if (!res)
        {
            fprintf(stderr, "No device found on %s\n", config.portArg.c_str());
            return 1;
        }

        Device device(samba);
        device.create();

        Device::FlashPtr& flash = device.getFlash();

        BossaObserver observer;
        Flasher flasher(samba, device, observer);

        if (config.info)
        {
            FlasherInfo info;
            flasher.info(info);
            info.print();
        }

        if (config.unlock)
            flasher.lock(config.unlockArg, false);

        if (config.erase)
        {
            timer_start();
            flasher.erase(config.offsetArg);
            printf("\nDone in %5.3f seconds\n", timer_stop());
        }

        if (config.write)
        {
            timer_start();
            flasher.write(argv[args], config.offsetArg);
            printf("\nDone in %5.3f seconds\n", timer_stop());
        }

        if (config.verify)
        {
            uint32_t pageErrors;
            uint32_t totalErrors;

            timer_start();
            if (!flasher.verify(argv[args], pageErrors, totalErrors, config.offsetArg))
            {
                printf("\nVerify failed\nPage errors: %d\nByte errors: %d\n",
                    pageErrors, totalErrors);
                return 2;
            }

            printf("\nVerify successful\nDone in %5.3f seconds\n", timer_stop());
        }

        if (config.read)
        {
            timer_start();
            flasher.read(argv[args], config.readArg, config.offsetArg);
            printf("\nDone in %5.3f seconds\n", timer_stop());
        }

        if (config.boot)
        {
            printf("Set boot flash %s\n", config.bootArg ? "true" : "false");
            flash->setBootFlash(config.bootArg);
        }

        if (config.bod)
        {
            printf("Set brownout detect %s\n", config.bodArg ? "true" : "false");
            flash->setBod(config.bodArg);
        }

        if (config.bor)
        {
            printf("Set brownout reset %s\n", config.borArg ? "true" : "false");
            flash->setBor(config.borArg);
        }

        if (config.security)
        {
            printf("Set security\n");
            flash->setSecurity();
        }

        if (config.lock)
            flasher.lock(config.lockArg, true);

        flash->writeOptions();

        if (config.reset)
            device.reset();
    }
    catch (exception& e)
    {
        fprintf(stderr, "\n%s\n", e.what());
        return 1;
    }
    catch(...)
    {
        fprintf(stderr, "\nUnhandled exception\n");
        return 1;
    }

    return 0;
}